

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O2

int cppcms::utf8::trail_length(uchar c)

{
  int iVar1;
  
  if (-1 < (char)c) {
    return 0;
  }
  if (c < 0xc2) {
    iVar1 = -1;
  }
  else if (c < 0xe0) {
    iVar1 = 1;
  }
  else {
    if (0xef < c) {
      return (c < 0xf5) - 1 | 3;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

inline int trail_length(unsigned char c) 
        {
            if(c < 128)
                return 0;
            if(c < 194)
                return -1;
            if(c < 224)
                return 1;
            if(c < 240)
                return 2;
            if(c <=244)
                return 3;
            return -1;
        }